

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_append_filter.c
# Opt level: O1

int archive_read_append_filter(archive *_a,int code)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  int iVar4;
  char **ppcVar5;
  char **ppcVar6;
  char str [20];
  char local_48 [24];
  
  uVar1 = code;
  switch(code) {
  case 0:
    break;
  case 1:
    builtin_strncpy(local_48,"gzip",5);
    uVar1 = archive_read_support_filter_gzip(_a);
    break;
  case 2:
    builtin_strncpy(local_48,"bzip2",6);
    uVar1 = archive_read_support_filter_bzip2(_a);
    break;
  case 3:
    builtin_strncpy(local_48 + 8," (.Z)",6);
    builtin_strncpy(local_48,"compress",8);
    uVar1 = archive_read_support_filter_compress(_a);
    break;
  case 4:
    pcVar3 = "Cannot append program filter using archive_read_append_filter";
    goto LAB_001f02d3;
  case 5:
    builtin_strncpy(local_48,"lzma",5);
    uVar1 = archive_read_support_filter_lzma(_a);
    break;
  case 6:
    local_48[2] = 0;
    local_48[0] = 'x';
    local_48[1] = 'z';
    uVar1 = archive_read_support_filter_xz(_a);
    break;
  case 7:
    local_48[2] = 0;
    local_48[0] = 'u';
    local_48[1] = 'u';
    uVar1 = archive_read_support_filter_uu(_a);
    break;
  case 8:
    builtin_strncpy(local_48,"rpm",4);
    uVar1 = archive_read_support_filter_rpm(_a);
    break;
  case 9:
    builtin_strncpy(local_48,"lzip",5);
    uVar1 = archive_read_support_filter_lzip(_a);
    break;
  case 10:
    builtin_strncpy(local_48,"lrzip",6);
    uVar1 = archive_read_support_filter_lrzip(_a);
    break;
  default:
    pcVar3 = "Invalid filter code specified";
    goto LAB_001f02d3;
  }
  if (code != 0) {
    ppcVar5 = &_a[2].compression_name;
    iVar4 = 0xe;
    do {
      ppcVar6 = ppcVar5;
      if ((ppcVar5[1] == (char *)0x0) || (iVar2 = strcmp(ppcVar5[1],local_48), iVar2 == 0)) break;
      ppcVar5 = ppcVar5 + 6;
      iVar4 = iVar4 + -1;
      ppcVar6 = &_a[8].compression_name;
    } while (iVar4 != 0);
    if ((ppcVar6[1] == (char *)0x0) || (iVar4 = strcmp(ppcVar6[1],local_48), iVar4 != 0)) {
      pcVar3 = "Internal error: Unable to append filter";
LAB_001f02d3:
      iVar4 = 0x16;
    }
    else {
      pcVar3 = (char *)calloc(1,0xb0);
      if (pcVar3 != (char *)0x0) {
        *(char ***)(pcVar3 + 8) = ppcVar6;
        *(archive **)(pcVar3 + 0x18) = _a;
        *(char **)(pcVar3 + 0x10) = _a[8].compression_name;
        _a[8].compression_name = pcVar3;
        iVar4 = (*(code *)((archive_string *)(ppcVar6 + 3))->s)(pcVar3);
        if (iVar4 != 0) {
          __archive_read_close_filters((archive_read *)_a);
          __archive_read_free_filters((archive_read *)_a);
          return -0x1e;
        }
        goto LAB_001f0334;
      }
      pcVar3 = "Out of memory";
      iVar4 = 0xc;
    }
    archive_set_error(_a,iVar4,pcVar3);
    return -0x1e;
  }
LAB_001f0334:
  _a[8].file_count = 1;
  return (int)uVar1 >> 0x1f & uVar1;
}

Assistant:

int
archive_read_append_filter(struct archive *_a, int code)
{
  int r1, r2, number_bidders, i;
  char str[20];
  struct archive_read_filter_bidder *bidder;
  struct archive_read_filter *filter;
  struct archive_read *a = (struct archive_read *)_a;

  r1 = r2 = (ARCHIVE_OK);
  switch (code)
  {
    case ARCHIVE_FILTER_NONE:
      /* No filter to add, so do nothing.
       * NOTE: An initial "NONE" type filter is always set at the end of the
       * filter chain.
       */
      r1 = (ARCHIVE_OK);
      break;
    case ARCHIVE_FILTER_GZIP:
      strcpy(str, "gzip");
      r1 = archive_read_support_filter_gzip(_a);
      break;
    case ARCHIVE_FILTER_BZIP2:
      strcpy(str, "bzip2");
      r1 = archive_read_support_filter_bzip2(_a);
      break;
    case ARCHIVE_FILTER_COMPRESS:
      strcpy(str, "compress (.Z)");
      r1 = archive_read_support_filter_compress(_a);
      break;
    case ARCHIVE_FILTER_PROGRAM:
      archive_set_error(&a->archive, ARCHIVE_ERRNO_PROGRAMMER,
          "Cannot append program filter using archive_read_append_filter");
      return (ARCHIVE_FATAL);
    case ARCHIVE_FILTER_LZMA:
      strcpy(str, "lzma");
      r1 = archive_read_support_filter_lzma(_a);
      break;
    case ARCHIVE_FILTER_XZ:
      strcpy(str, "xz");
      r1 = archive_read_support_filter_xz(_a);
      break;
    case ARCHIVE_FILTER_UU:
      strcpy(str, "uu");
      r1 = archive_read_support_filter_uu(_a);
      break;
    case ARCHIVE_FILTER_RPM:
      strcpy(str, "rpm");
      r1 = archive_read_support_filter_rpm(_a);
      break;
    case ARCHIVE_FILTER_LZIP:
      strcpy(str, "lzip");
      r1 = archive_read_support_filter_lzip(_a);
      break;
    case ARCHIVE_FILTER_LRZIP:
      strcpy(str, "lrzip");
      r1 = archive_read_support_filter_lrzip(_a);
      break;
    default:
      archive_set_error(&a->archive, ARCHIVE_ERRNO_PROGRAMMER,
          "Invalid filter code specified");
      return (ARCHIVE_FATAL);
  }

  if (code != ARCHIVE_FILTER_NONE)
  {
    number_bidders = sizeof(a->bidders) / sizeof(a->bidders[0]);

    bidder = a->bidders;
    for (i = 0; i < number_bidders; i++, bidder++)
    {
      if (!bidder->name || !strcmp(bidder->name, str))
        break;
    }
    if (!bidder->name || strcmp(bidder->name, str))
    {
      archive_set_error(&a->archive, ARCHIVE_ERRNO_PROGRAMMER,
          "Internal error: Unable to append filter");
      return (ARCHIVE_FATAL);
    }

    filter
        = (struct archive_read_filter *)calloc(1, sizeof(*filter));
    if (filter == NULL)
    {
      archive_set_error(&a->archive, ENOMEM, "Out of memory");
      return (ARCHIVE_FATAL);
    }
    filter->bidder = bidder;
    filter->archive = a;
    filter->upstream = a->filter;
    a->filter = filter;
    r2 = (bidder->init)(a->filter);
    if (r2 != ARCHIVE_OK) {
      __archive_read_close_filters(a);
      __archive_read_free_filters(a);
      return (ARCHIVE_FATAL);
    }
  }

  a->bypass_filter_bidding = 1;
  return (r1 < r2) ? r1 : r2;
}